

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

bool __thiscall Instruction::isJump(Instruction *this)

{
  byte bVar1;
  
  bVar1 = this->m_OpCode;
  if ((((0x3c < bVar1 - 0x10) || ((0x1000000100050001U >> ((ulong)(bVar1 - 0x10) & 0x3f) & 1) == 0))
      && ((0x24 < bVar1 - 0x5c || ((0x1100010001U >> ((ulong)(bVar1 - 0x5c) & 0x3f) & 1) == 0)))) &&
     ((0x2c < bVar1 - 0xd0 || ((0x100000001001U >> ((ulong)(bVar1 - 0xd0) & 0x3f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool Instruction::isJump() const {
    switch(m_OpCode) {
    case 0x10: //Branch if Plus
    case 0x20: //Jump to Subroutine
    case 0x30: //Branch if Minus
    case 0x22: //Jump to Subroutine
    case 0x4C: //Jump
    case 0x5C: //Jump
    case 0x6C: //Jump
    case 0x7C: //Jump
    case 0x80: //Branch Always
    case 0xD0: //Branch if Not Equal
    case 0xDC: //Jump
    case 0xFC: //Jump to Subroutine
        return true;
    default:
        return false;
    }
}